

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_hkdf.cc
# Opt level: O2

int pkey_hkdf_init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  void *orig_ptr;
  int iVar2;
  
  orig_ptr = OPENSSL_zalloc(0x60);
  if (orig_ptr == (void *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    iVar1 = CBB_init((CBB *)((long)orig_ptr + 0x30),0);
    if (iVar1 == 0) {
      OPENSSL_free(orig_ptr);
    }
    else {
      ctx->data = orig_ptr;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int pkey_hkdf_init(EVP_PKEY_CTX *ctx) {
  HKDF_PKEY_CTX *hctx =
      reinterpret_cast<HKDF_PKEY_CTX *>(OPENSSL_zalloc(sizeof(HKDF_PKEY_CTX)));
  if (hctx == NULL) {
    return 0;
  }

  if (!CBB_init(&hctx->info, 0)) {
    OPENSSL_free(hctx);
    return 0;
  }

  ctx->data = hctx;
  return 1;
}